

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O2

ParamGenerator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
google::protobuf::anon_unknown_0::gtest_PoolDescriptorDatabaseTest_EvalGenerator_(void)

{
  ValueArray *in_RDI;
  ParamGenerator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()> PVar1;
  
  PVar1 = testing::internal::ValueArray::operator_cast_to_ParamGenerator(in_RDI);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)in_RDI;
  return (ParamGenerator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
         )PVar1.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

TEST(EncodedDescriptorDatabaseExtraTest, FindNameOfFileContainingSymbol) {
  // Create two files, one of which is in two parts.
  FileDescriptorProto file1, file2a, file2b;
  file1.set_name("foo.proto");
  file1.set_package("foo");
  file1.add_message_type()->set_name("Foo");
  file2a.set_name("bar.proto");
  file2b.set_package("bar");
  file2b.add_message_type()->set_name("Bar");

  // Normal serialization allows our optimization to kick in.
  std::string data1 = file1.SerializeAsString();

  // Force out-of-order serialization to test slow path.
  std::string data2 = file2b.SerializeAsString() + file2a.SerializeAsString();

  // Create EncodedDescriptorDatabase containing both files.
  EncodedDescriptorDatabase db;
  db.Add(data1.data(), data1.size());
  db.Add(data2.data(), data2.size());

  // Test!
  std::string filename;
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("foo.Foo", &filename));
  EXPECT_EQ("foo.proto", filename);
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("foo.Foo.Blah", &filename));
  EXPECT_EQ("foo.proto", filename);
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("bar.Bar", &filename));
  EXPECT_EQ("bar.proto", filename);
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("foo", &filename));
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("bar", &filename));
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("baz.Baz", &filename));
}